

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nonogram.cpp
# Opt level: O3

void __thiscall Nonogram::set_horizontal(Nonogram *this,Known *known,uint y)

{
  ulong *puVar1;
  int iVar2;
  long lVar3;
  _Bit_type *p_Var4;
  long lVar5;
  ulong uVar6;
  byte bVar7;
  ulong uVar8;
  pointer pvVar9;
  pointer pvVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  
  iVar2 = this->m_x;
  if (0 < (long)iVar2) {
    lVar3 = (long)(known->first).super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    p_Var4 = (known->second).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    pvVar10 = (this->m_set).
              super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pvVar9 = (this->m_value).
             super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar11 = 1L << ((byte)y & 0x3f);
    bVar7 = (byte)y & 0x3f;
    uVar8 = 0;
    uVar12 = (ulong)((y >> 6) << 3);
    do {
      uVar14 = uVar8 >> 6 & 0x3ffffff;
      if ((*(ulong *)(lVar3 + uVar14 * 8) >> (uVar8 & 0x3f) & 1) != 0) {
        puVar1 = (ulong *)(*(long *)&(pvVar10->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                     super__Bvector_impl_data + uVar12);
        *puVar1 = *puVar1 | uVar11;
        lVar5 = *(long *)&(pvVar9->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                          super__Bvector_impl_data;
        uVar6 = *(ulong *)(lVar5 + uVar12);
        uVar13 = uVar6 | uVar11;
        if ((p_Var4[uVar14] & 1L << ((byte)uVar8 & 0x3f)) == 0) {
          uVar13 = uVar6 & (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
        }
        *(ulong *)(lVar5 + uVar12) = uVar13;
      }
      uVar8 = uVar8 + 1;
      pvVar10 = pvVar10 + 1;
      pvVar9 = pvVar9 + 1;
    } while ((long)iVar2 != uVar8);
  }
  return;
}

Assistant:

void Nonogram::set_horizontal(const Known &known, unsigned int y) {
    for (int i = 0; i < m_x; i++) {
        if (known.first[i]) {
            m_set[i][y] = known.first[i];
            m_value[i][y] = known.second[i];
        }
    }
}